

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::DeepScanLineInputFile::Data::initialize(Data *this)

{
  exr_storage_t eVar1;
  int iVar2;
  ArgExc *this_00;
  long in_RDI;
  Context *in_stack_00000180;
  int in_stack_000001ac;
  Context *in_stack_000001b0;
  
  eVar1 = Context::storage(in_stack_000001b0,in_stack_000001ac);
  if (eVar1 != EXR_STORAGE_DEEP_SCANLINE) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"File part is not a deep scanline part");
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar2 = Context::version(in_stack_00000180);
  *(int *)(in_RDI + 0x10) = iVar2;
  return;
}

Assistant:

void initialize ()
    {
        if (_ctxt->storage (partNumber) != EXR_STORAGE_DEEP_SCANLINE)
            throw IEX_NAMESPACE::ArgExc ("File part is not a deep scanline part");

        version = _ctxt->version ();
    }